

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

bool __thiscall
kratos::InsertClockIRVisitor::has_clk_en_stmt(InsertClockIRVisitor *this,StmtBlock *block)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  size_t __n;
  bool bVar4;
  int iVar5;
  byte unaff_R15B;
  undefined1 local_48 [8];
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::Port> p;
  
  psVar1 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar2 = (psVar1->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar1->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (peVar2->type_ == If) {
      Stmt::as<kratos::IfStmt>((Stmt *)local_48);
      p_Var3 = *(_func_int **)((long)local_48 + 0xc0);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48 + 200);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (*(int *)(p_Var3 + 0x168) == 6) {
        Var::as<kratos::VarCasted>
                  ((Var *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        unaff_R15B = *(int *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[0x28]._vptr__Sp_counted_base == 4;
        if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        goto LAB_00216d13;
      }
      if (*(int *)(p_Var3 + 0x168) == 4) {
        Var::as<kratos::Port>
                  ((Var *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        iVar5 = *(int *)((long)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[0x27]._vptr__Sp_counted_base + 4);
        if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (iVar5 == 4) {
          bVar4 = false;
          unaff_R15B = true;
        }
        else {
LAB_00216d0b:
          unaff_R15B = true;
          bVar4 = true;
        }
      }
      else {
        __n = *(size_t *)(p_Var3 + 0x80);
        if (__n != (this->clk_en_name_)._M_string_length) goto LAB_00216d0b;
        unaff_R15B = true;
        if (__n != 0) {
          iVar5 = bcmp(*(void **)(p_Var3 + 0x78),(this->clk_en_name_)._M_dataplus._M_p,__n);
          if (iVar5 != 0) goto LAB_00216d0b;
        }
LAB_00216d13:
        bVar4 = false;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    else {
      bVar4 = true;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (!bVar4) goto LAB_00216d46;
  }
  unaff_R15B = 0;
LAB_00216d46:
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool has_clk_en_stmt(StmtBlock* block) const {
        if (!block->empty()) {
            auto stmt = block->get_stmt(0);
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto cond = if_->predicate();
                if (cond->type() == VarType::PortIO) {
                    auto p = cond->as<Port>();
                    if (p->port_type() == PortType::ClockEnable) {
                        return true;
                    }
                } else if (cond->type() == VarType::BaseCasted) {
                    auto casted = cond->as<VarCasted>();
                    return casted->cast_type() == VarCastType::ClockEnable;
                } else if (cond->name == clk_en_name_) {
                    return true;
                }
            }
        }
        return false;
    }